

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall
testing::internal::TypedExpectation<bool_(unsigned_short)>::~TypedExpectation
          (TypedExpectation<bool_(unsigned_short)> *this)

{
  void *pvVar1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer ppvVar4;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_0039f760;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar4 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar4 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar4 = ppvVar4 + 1) {
    pvVar1 = *ppvVar4;
    if ((pvVar1 != (void *)0x0) && (*(code **)((long)pvVar1 + 0x10) != (code *)0x0)) {
      (**(code **)((long)pvVar1 + 0x10))(pvVar1,pvVar1,3);
    }
    operator_delete(pvVar1);
  }
  p_Var2 = (this->repeated_action_).fun_.super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->repeated_action_,(_Any_data *)&this->repeated_action_,
              __destroy_functor);
  }
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<unsigned_short>_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00398c80;
  p_Var3 = (this->extra_matcher_).super_MatcherBase<const_std::tuple<unsigned_short>_&>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_std::tuple<unsigned_short>_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
  super_MatcherBase<unsigned_short>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00396a78;
  p_Var3 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>_>.
                   super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
                   super_MatcherBase<unsigned_short>.impl_.
                   super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
           + 8))->_M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

~TypedExpectation() override {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }